

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  pointer pSVar4;
  uint uVar5;
  ulong uVar6;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  uVar5 = 0;
  (**(code **)(lVar2 + 0xb8))(0x9009,0);
  (**(code **)(lVar2 + 0xff0))(0xd05,4);
  (**(code **)(lVar2 + 0xff0))(0xcf5,4);
  pSVar4 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar6 = (ulong)uVar5;
    lVar3 = (long)(this->m_non_filterable_texture_configs).
                  super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar4;
    if ((ulong)(lVar3 / 0x14) <= uVar6) break;
    if (pSVar4[uVar6].m_to_id != 0) {
      (**(code **)(lVar2 + 0x480))(1,&pSVar4[uVar6].m_to_id,lVar3 % 0x14);
      pSVar4 = (this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar4[uVar6].m_to_id = 0;
    }
    uVar5 = uVar5 + 1;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Restore default bindings */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Restore default pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Delete all textures the test may have created. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_non_filterable_texture_configs.size();
		 ++n_storage_config)
	{
		if (m_non_filterable_texture_configs[n_storage_config].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_non_filterable_texture_configs[n_storage_config].m_to_id);

			m_non_filterable_texture_configs[n_storage_config].m_to_id = 0;
		}
	}

	/* Call base class' deinit() implementation */
	TestCaseBase::deinit();
}